

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

unzFile unzOpen2(char *path,zlib_filefunc_def *pzlib_filefunc32_def)

{
  unzFile pvVar1;
  zlib_filefunc64_32_def zlib_filefunc64_32_def_fill;
  zlib_filefunc64_32_def zStack_68;
  
  if (pzlib_filefunc32_def != (zlib_filefunc_def *)0x0) {
    fill_zlib_filefunc64_32_def_from_filefunc32(&zStack_68,pzlib_filefunc32_def);
    pvVar1 = unzOpenInternal(path,&zStack_68,0);
    return pvVar1;
  }
  pvVar1 = unzOpenInternal(path,(zlib_filefunc64_32_def *)0x0,0);
  return pvVar1;
}

Assistant:

extern unzFile ZEXPORT unzOpen2(const char* path,
    zlib_filefunc_def* pzlib_filefunc32_def)
{
    if (pzlib_filefunc32_def != NULL)
    {
        zlib_filefunc64_32_def zlib_filefunc64_32_def_fill;
        fill_zlib_filefunc64_32_def_from_filefunc32(&zlib_filefunc64_32_def_fill, pzlib_filefunc32_def);
        return unzOpenInternal(path, &zlib_filefunc64_32_def_fill, 0);
    }
    else
        return unzOpenInternal(path, NULL, 0);
}